

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Node *pNVar2;
  Bool BVar3;
  int iVar4;
  NodeType NVar5;
  uint uVar6;
  Node *pNVar7;
  Node **ppNVar8;
  GetTokenMode mode_00;
  
  pLVar1 = doc->lexer;
  BVar3 = prvTidyXMLPreserveWhiteSpace(doc,element);
  mode_00 = Preformatted;
  if (BVar3 == no) {
    mode_00 = mode;
  }
LAB_00141f90:
  do {
    pNVar7 = prvTidyGetToken(doc,mode_00);
    if (pNVar7 == (Node *)0x0) {
LAB_0014203b:
      pNVar7 = element->content;
      BVar3 = prvTidynodeIsText(pNVar7);
      if ((((mode_00 != Preformatted) && (BVar3 != no)) && (pLVar1->lexbuf[pNVar7->start] == ' '))
         && (uVar6 = pNVar7->start + 1, pNVar7->start = uVar6, pNVar7->end <= uVar6)) {
        prvTidyDiscardElement(doc,pNVar7);
      }
      pNVar7 = element->last;
      BVar3 = prvTidynodeIsText(pNVar7);
      if (((mode_00 != Preformatted) && (BVar3 != no)) &&
         ((uVar6 = pNVar7->end - 1, pLVar1->lexbuf[uVar6] == ' ' &&
          (pNVar7->end = uVar6, uVar6 <= pNVar7->start)))) {
        prvTidyDiscardElement(doc,pNVar7);
        return;
      }
      return;
    }
    NVar5 = pNVar7->type;
    if (NVar5 == EndTag) {
      if ((pNVar7->element != (ctmbstr)0x0) && (element->element != (ctmbstr)0x0)) {
        iVar4 = prvTidytmbstrcmp(pNVar7->element,element->element);
        if (iVar4 != 0) {
          NVar5 = pNVar7->type;
          goto LAB_00141fcd;
        }
        prvTidyFreeNode(doc,pNVar7);
        element->closed = yes;
        goto LAB_0014203b;
      }
LAB_00141fd7:
      prvTidyReport(doc,element,pNVar7,0x286);
      prvTidyFreeNode(doc,pNVar7);
      goto LAB_00141f90;
    }
LAB_00141fcd:
    if (NVar5 == StartTag) {
      ParseXMLElement(doc,pNVar7,mode_00);
    }
    else if (NVar5 == EndTag) goto LAB_00141fd7;
    pNVar7->parent = element;
    pNVar2 = element->last;
    pNVar7->prev = pNVar2;
    ppNVar8 = &pNVar2->next;
    if (pNVar2 == (Node *)0x0) {
      ppNVar8 = &element->content;
    }
    *ppNVar8 = pNVar7;
    element->last = pNVar7;
  } while( true );
}

Assistant:

static void ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    /* if node is pre or has xml:space="preserve" then do so */

    if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
        mode = Preformatted;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
            ParseXMLElement( doc, node, mode );

        TY_(InsertNodeAtEnd)(element, node);
    }

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
}